

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyedgecurve.cpp
# Opt level: O3

bool __thiscall ON_PolyEdgeSegment::Write(ON_PolyEdgeSegment *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  ON_Interval local_30;
  
  bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(archive,0x40008000,1,0);
  if (!bVar1) {
    return false;
  }
  bVar1 = ON_BinaryArchive::WriteUuid(archive,&this->m_object_id);
  if ((((bVar1) &&
       (bVar1 = ON_BinaryArchive::WriteComponentIndex(archive,&this->m_component_index), bVar1)) &&
      (bVar1 = ON_BinaryArchive::WriteInterval(archive,&this->m_edge_domain), bVar1)) &&
     (bVar1 = ON_BinaryArchive::WriteInterval(archive,&this->m_trim_domain), bVar1)) {
    bVar1 = ON_CurveProxy::ProxyCurveIsReversed(&this->super_ON_CurveProxy);
    bVar1 = ON_BinaryArchive::WriteBool(archive,bVar1);
    if (bVar1) {
      local_30 = ON_CurveProxy::Domain(&this->super_ON_CurveProxy);
      bVar1 = ON_BinaryArchive::WriteInterval(archive,&local_30);
      if (bVar1) {
        local_30 = ON_CurveProxy::ProxyCurveDomain(&this->super_ON_CurveProxy);
        bVar1 = ON_BinaryArchive::WriteInterval(archive,&local_30);
        goto LAB_0058e566;
      }
    }
  }
  bVar1 = false;
LAB_0058e566:
  bVar2 = ON_BinaryArchive::EndWrite3dmChunk(archive);
  return (bool)(bVar2 & bVar1);
}

Assistant:

bool ON_PolyEdgeSegment::Write( ON_BinaryArchive& archive ) const
{
  bool rc = archive.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,0);
  if (!rc)
    return false;
  for(;;)
  {
    rc = archive.WriteUuid(m_object_id);
    if (!rc) break;
    rc = archive.WriteComponentIndex(m_component_index);
    if (!rc) break;
    rc = archive.WriteInterval(m_edge_domain);
    if (!rc) break;
    rc = archive.WriteInterval(m_trim_domain);
    if (!rc) break;
    bool b = ON_CurveProxy::ProxyCurveIsReversed();
    rc = archive.WriteBool(b);
    if (!rc) break;
    rc = archive.WriteInterval(ON_CurveProxy::Domain());
    if (!rc) break;
    rc = archive.WriteInterval(ON_CurveProxy::ProxyCurveDomain());
    if (!rc) break;

    break;
  }
  if ( !archive.EndWrite3dmChunk() )
    rc = false;
  return rc;
}